

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_iTXt(ucvector *out,uint compress,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  size_t insize;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  long lVar1;
  long lVar2;
  size_t local_a0;
  size_t pos;
  size_t size;
  size_t transsize;
  size_t langsize;
  size_t keysize;
  size_t textsize;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  uchar *puStack_40;
  uint error;
  char *textstring_local;
  char *transkey_local;
  char *langtag_local;
  char *keyword_local;
  ucvector *puStack_18;
  uint compress_local;
  ucvector *out_local;
  
  chunk._4_4_ = 0;
  compressed = (uchar *)0x0;
  compressedsize = 0;
  textsize = 0;
  puStack_40 = (uchar *)textstring;
  textstring_local = transkey;
  transkey_local = langtag;
  langtag_local = keyword;
  keyword_local._4_4_ = compress;
  puStack_18 = out;
  insize = lodepng_strlen(textstring);
  size_00 = lodepng_strlen(langtag_local);
  size_01 = lodepng_strlen(transkey_local);
  size_02 = lodepng_strlen(textstring_local);
  if ((size_00 == 0) || (0x4f < size_00)) {
    out_local._4_4_ = 0x59;
  }
  else {
    if (keyword_local._4_4_ != 0) {
      chunk._4_4_ = zlib_compress((uchar **)&compressedsize,&textsize,puStack_40,insize,zlibsettings
                                 );
    }
    if (chunk._4_4_ == 0) {
      local_a0 = insize;
      if (keyword_local._4_4_ != 0) {
        local_a0 = textsize;
      }
      chunk._4_4_ = lodepng_chunk_init(&compressed,puStack_18,
                                       size_00 + size_01 + size_02 + 5 + local_a0,"iTXt");
    }
    if (chunk._4_4_ == 0) {
      lodepng_memcpy(compressed + 8,langtag_local,size_00);
      compressed[size_00 + 8] = '\0';
      compressed[size_00 + 9] = keyword_local._4_4_ != 0;
      compressed[size_00 + 10] = '\0';
      lodepng_memcpy(compressed + size_00 + 0xb,transkey_local,size_01);
      lVar1 = size_01 + size_00 + 0xb;
      lVar2 = lVar1 + 1;
      compressed[lVar1] = '\0';
      lodepng_memcpy(compressed + lVar2,textstring_local,size_02);
      lVar2 = size_02 + lVar2;
      lVar1 = lVar2 + 1;
      compressed[lVar2] = '\0';
      if (keyword_local._4_4_ == 0) {
        lodepng_memcpy(compressed + lVar1,puStack_40,insize);
      }
      else {
        lodepng_memcpy(compressed + lVar1,(void *)compressedsize,textsize);
      }
      lodepng_chunk_generate_crc(compressed);
    }
    lodepng_free((void *)compressedsize);
    out_local._4_4_ = chunk._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compress, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword), langsize = lodepng_strlen(langtag), transsize = lodepng_strlen(transkey);

  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  if(compress) {
    error = zlib_compress(&compressed, &compressedsize,
                          (const unsigned char*)textstring, textsize, zlibsettings);
  }
  if(!error) {
    size_t size = keysize + 3 + langsize + 1 + transsize + 1 + (compress ? compressedsize : textsize);
    error = lodepng_chunk_init(&chunk, out, size, "iTXt");
  }
  if(!error) {
    size_t pos = 8;
    lodepng_memcpy(chunk + pos, keyword, keysize);
    pos += keysize;
    chunk[pos++] = 0; /*null termination char*/
    chunk[pos++] = (compress ? 1 : 0); /*compression flag*/
    chunk[pos++] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + pos, langtag, langsize);
    pos += langsize;
    chunk[pos++] = 0; /*null termination char*/
    lodepng_memcpy(chunk + pos, transkey, transsize);
    pos += transsize;
    chunk[pos++] = 0; /*null termination char*/
    if(compress) {
      lodepng_memcpy(chunk + pos, compressed, compressedsize);
    } else {
      lodepng_memcpy(chunk + pos, textstring, textsize);
    }
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}